

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bup.cpp
# Opt level: O1

int processBup(istream *in,path *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t uVar3;
  long lVar4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  undefined8 *puVar9;
  Point PVar10;
  Size *pSVar11;
  long *plVar12;
  ulong *puVar13;
  Size SVar14;
  long *plVar15;
  ulong uVar16;
  char cVar17;
  undefined8 uVar18;
  uint __len;
  pointer pBVar19;
  uint32_t *puVar20;
  ulong uVar21;
  pointer pBVar22;
  undefined1 auVar23 [16];
  string __str;
  unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> out;
  Image withMouth;
  string outTemplate;
  vector<MaskRect,_std::allocator<MaskRect>_> maskData;
  string __str_2;
  Image base;
  BupHeader header;
  path outputDir;
  string_type local_2a0;
  long *local_280;
  string local_278;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [2];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  istream *local_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  vector<MaskRect,_std::allocator<MaskRect>_> local_1d8;
  pointer local_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  Image local_178;
  Image local_158;
  long *local_138 [2];
  long local_128 [2];
  undefined1 local_118 [32];
  _List local_f8;
  vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> vStack_f0;
  Size local_d8;
  pointer local_d0;
  pointer pCStack_c8;
  pointer local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  vector<MaskRect,_std::allocator<MaskRect>_> local_98;
  path local_80;
  path local_58;
  
  local_200 = in;
  std::filesystem::__cxx11::path::parent_path();
  auVar23 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar23._8_8_ == 0 || auVar23._0_8_ == 0) {
    std::filesystem::__cxx11::path::path((path *)local_118);
  }
  else {
    std::__cxx11::string::substr((ulong)local_228,auVar23._0_8_);
    std::filesystem::__cxx11::path::path((path *)local_118,(string_type *)local_228,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &local_218) {
      operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
    }
  }
  lVar4 = CONCAT26(local_118._6_2_,CONCAT51(local_118._1_5_,local_118[0]));
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,lVar4,CONCAT62(local_118._10_6_,local_118._8_2_) + lVar4);
  std::filesystem::__cxx11::path::~path((path *)local_118);
  if (SAVE_BUP_AS_PARTS == true) {
    BupOutputter::makeParts();
  }
  else {
    BupOutputter::makeComposited();
  }
  vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._16_8_ = (uint32_t *)0x0;
  local_118._24_8_ = (uint32_t *)0x0;
  operator>>(local_200,(BupHeader *)local_118);
  local_178.size = (Size)((ulong)(ushort)local_118._6_2_ + ((ulong)(ushort)local_118._8_2_ << 0x20))
  ;
  local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
  std::vector<Color,_std::allocator<Color>_>::vector
            (&local_178.colorData,
             (long)(int)((uint)(ushort)local_118._6_2_ * (uint)(ushort)local_118._8_2_),
             (value_type *)local_228,(allocator_type *)local_258);
  local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.size.width = 0;
  local_158.size.height = 0;
  local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0 = (pointer)local_118._24_8_;
  if (local_118._16_8_ != local_118._24_8_) {
    puVar20 = (uint32_t *)local_118._16_8_;
    do {
      uVar18 = local_118._16_8_;
      uVar3 = *puVar20;
      local_258._0_8_ = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_258,local_1f8,local_1f0 + (long)local_1f8);
      std::__cxx11::string::append((char *)local_258);
      uVar21 = (long)puVar20 - uVar18 >> 2;
      cVar17 = '\x01';
      paVar2 = &local_2a0.field_2;
      if (9 < uVar21) {
        uVar16 = uVar21;
        cVar6 = '\x04';
        do {
          cVar17 = cVar6;
          if (uVar16 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_001119e7;
          }
          if (uVar16 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_001119e7;
          }
          if (uVar16 < 10000) goto LAB_001119e7;
          bVar7 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar6 = cVar17 + '\x04';
        } while (bVar7);
        cVar17 = cVar17 + '\x01';
      }
LAB_001119e7:
      local_2a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct((ulong)&local_2a0,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_2a0._M_dataplus._M_p,(uint)local_2a0._M_string_length,uVar21);
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._0_8_ != local_248) {
        uVar18 = local_248[0]._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_2a0._M_string_length + local_258._8_8_) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar2) {
          uVar18 = local_2a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_2a0._M_string_length + local_258._8_8_) goto LAB_00111a4d;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,local_258._0_8_);
      }
      else {
LAB_00111a4d:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append(local_258,(ulong)local_2a0._M_dataplus._M_p);
      }
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 == paVar1) {
        local_218._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_218._8_8_ = puVar9[3];
        local_228._0_8_ = &local_218;
      }
      else {
        local_218._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_228._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar9;
      }
      local_228._8_8_ = puVar9[1];
      *puVar9 = paVar1;
      puVar9[1] = 0;
      paVar1->_M_local_buf[0] = '\0';
      PVar10 = processChunk(&local_158,&local_1d8,uVar3,local_200,(string *)local_228,local_118[0]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ != &local_218) {
        operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._0_8_ != local_248) {
        operator_delete((void *)local_258._0_8_,local_248[0]._M_allocated_capacity + 1);
      }
      std::vector<MaskRect,_std::allocator<MaskRect>_>::vector(&local_98,&local_1d8);
      Image::drawOnto(&local_158,&local_178,PVar10,&local_98);
      if (local_98.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      puVar20 = puVar20 + 1;
    } while ((pointer)puVar20 != local_1c0);
  }
  if (SHOULD_WRITE_DEBUG_IMAGES != false) {
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_1f8,local_1f0 + (long)local_1f8);
    std::__cxx11::string::append((char *)&local_2a0);
    std::filesystem::__cxx11::path::path((path *)local_258,&local_2a0,auto_format);
    std::filesystem::__cxx11::operator/
              ((path *)local_228,&debugImagePath_abi_cxx11_,(path *)local_258);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
    Image::writePNG(&local_178,(path *)local_228,&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_228);
    std::filesystem::__cxx11::path::~path((path *)local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
  }
  plVar12 = local_280;
  std::filesystem::__cxx11::path::path(&local_80,&local_58);
  local_d8 = local_178.size;
  local_d0 = local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start;
  pCStack_c8 = local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_c0 = local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,local_1f8,local_1f0 + (long)local_1f8);
  (**(code **)(*plVar12 + 0x10))(plVar12,&local_80,&local_d8,local_b8);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (local_d0 != (pointer)0x0) {
    operator_delete(local_d0,(long)local_c0 - (long)local_d0);
  }
  std::filesystem::__cxx11::path::~path(&local_80);
  local_218._M_allocated_capacity = 0;
  local_218._8_8_ = 0;
  local_228._0_4_ = 0;
  local_228._4_4_ = 0;
  local_228._8_8_ = (void *)0x0;
  local_1c0 = vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
      super__Vector_impl_data._M_start !=
      vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar22 = vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_228._0_4_ = local_178.size.width;
      local_228._4_4_ = local_178.size.height;
      std::vector<Color,_std::allocator<Color>_>::operator=
                ((vector<Color,_std::allocator<Color>_> *)(local_228 + 8),&local_178.colorData);
      plVar12 = local_280;
      uVar3 = (pBVar22->face).offset;
      if (uVar3 == 0) {
        local_248[0]._M_allocated_capacity = 0;
        local_248[0]._8_8_ = 0;
        local_258._0_4_ = 0;
        local_258._4_4_ = 0;
        local_258._8_4_ = 0;
        local_258._12_4_ = 0;
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
        local_278._M_dataplus._M_p = (pointer)0x0;
        local_278._M_string_length = 0;
        local_278.field_2._M_allocated_capacity = 0;
        (**(code **)(*plVar12 + 0x18))(plVar12,local_258,0,&local_2a0,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_278._M_dataplus._M_p,
                          local_278.field_2._M_allocated_capacity - (long)local_278._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((Size)local_258._8_8_ != (Size)0x0) {
          operator_delete((void *)local_258._8_8_,local_248[0]._8_8_ - local_258._8_8_);
        }
      }
      else {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_1f8,local_1f0 + (long)local_1f8);
        std::__cxx11::string::append((char *)&local_278);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_278,(ulong)(pBVar22->name)._M_dataplus._M_p);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        puVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_2a0.field_2._M_allocated_capacity = *puVar13;
          local_2a0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *puVar13;
          local_2a0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_2a0._M_string_length = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        pSVar11 = (Size *)std::__cxx11::string::append((char *)&local_2a0);
        local_258._0_8_ = local_248;
        SVar14 = (Size)(pSVar11 + 2);
        if (*pSVar11 == SVar14) {
          local_248[0]._0_8_ = *(undefined8 *)SVar14;
          local_248[0]._8_8_ = pSVar11[3];
        }
        else {
          local_248[0]._0_8_ = *(undefined8 *)SVar14;
          local_258._0_8_ = *pSVar11;
        }
        local_258._8_8_ = pSVar11[1];
        *pSVar11 = SVar14;
        pSVar11[1].width = 0;
        pSVar11[1].height = 0;
        *(undefined1 *)&pSVar11[2].width = 0;
        PVar10 = processChunk(&local_158,&local_1d8,uVar3,local_200,(string *)local_258,local_118[0]
                             );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ != local_248) {
          operator_delete((void *)local_258._0_8_,local_248[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        (**(code **)(*local_280 + 0x18))(local_280,&local_158,PVar10,pBVar22,&local_1d8);
      }
      pBVar19 = (pBVar22->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pBVar22->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
          super__Vector_impl_data._M_finish == pBVar19) {
LAB_001123d7:
        (**(code **)(*local_280 + 0x28))();
      }
      else {
        uVar21 = 0;
        bVar7 = false;
        do {
          if (pBVar19[uVar21].offset != 0) {
            local_258._0_8_ = local_228._0_8_;
            std::vector<Color,_std::allocator<Color>_>::vector
                      ((vector<Color,_std::allocator<Color>_> *)(local_258 + 8),
                       (vector<Color,_std::allocator<Color>_> *)(local_228 + 8));
            uVar3 = pBVar19[uVar21].offset;
            local_138[0] = local_128;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_138,local_1f8,local_1f0 + (long)local_1f8);
            std::__cxx11::string::append((char *)local_138);
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)local_138,(ulong)(pBVar22->name)._M_dataplus._M_p);
            local_198 = &local_188;
            plVar15 = plVar12 + 2;
            if ((long *)*plVar12 == plVar15) {
              local_188 = *plVar15;
              lStack_180 = plVar12[3];
            }
            else {
              local_188 = *plVar15;
              local_198 = (long *)*plVar12;
            }
            local_190 = plVar12[1];
            *plVar12 = (long)plVar15;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_198);
            puVar13 = (ulong *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_278.field_2._M_allocated_capacity = *puVar13;
              local_278.field_2._8_8_ = plVar12[3];
              local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            }
            else {
              local_278.field_2._M_allocated_capacity = *puVar13;
              local_278._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_278._M_string_length = plVar12[1];
            *plVar12 = (long)puVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            __len = 1;
            if (9 < uVar21) {
              uVar5 = 4;
              uVar16 = uVar21;
              do {
                __len = uVar5;
                uVar8 = (uint)uVar16;
                if (uVar8 < 100) {
                  __len = __len - 2;
                  goto LAB_001121aa;
                }
                if (uVar8 < 1000) {
                  __len = __len - 1;
                  goto LAB_001121aa;
                }
                if (uVar8 < 10000) goto LAB_001121aa;
                uVar16 = (uVar16 & 0xffffffff) / 10000;
                uVar5 = __len + 4;
              } while (99999 < uVar8);
              __len = __len + 1;
            }
LAB_001121aa:
            local_1b8 = local_1a8;
            std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b8,__len,(uint)uVar21);
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              uVar18 = local_278.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_1b0 + local_278._M_string_length) {
              uVar16 = 0xf;
              if (local_1b8 != local_1a8) {
                uVar16 = local_1a8[0];
              }
              if (uVar16 < local_1b0 + local_278._M_string_length) goto LAB_00112234;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p)
              ;
            }
            else {
LAB_00112234:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1b8);
            }
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            puVar13 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_2a0.field_2._M_allocated_capacity = *puVar13;
              local_2a0.field_2._8_8_ = puVar9[3];
            }
            else {
              local_2a0.field_2._M_allocated_capacity = *puVar13;
              local_2a0._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_2a0._M_string_length = puVar9[1];
            *puVar9 = puVar13;
            puVar9[1] = 0;
            *(undefined1 *)puVar13 = 0;
            PVar10 = processChunk(&local_158,&local_1d8,uVar3,local_200,&local_2a0,local_118[0]);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1b8 != local_1a8) {
              operator_delete(local_1b8,local_1a8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_198 != &local_188) {
              operator_delete(local_198,local_188 + 1);
            }
            if (local_138[0] != local_128) {
              operator_delete(local_138[0],local_128[0] + 1);
            }
            (**(code **)(*local_280 + 0x20))
                      (local_280,&local_158,PVar10,uVar21 & 0xffffffff,&local_1d8);
            (**(code **)(*local_280 + 0x28))();
            if ((Size)local_258._8_8_ != (Size)0x0) {
              operator_delete((void *)local_258._8_8_,local_248[0]._8_8_ - local_258._8_8_);
            }
            bVar7 = true;
          }
          uVar21 = uVar21 + 1;
          pBVar19 = (pBVar22->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar21 < (ulong)((long)(pBVar22->mouths).
                                        super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pBVar19 >>
                                 2));
        if (!bVar7) goto LAB_001123d7;
      }
      pBVar22 = pBVar22 + 1;
    } while (pBVar22 != local_1c0);
  }
  if ((void *)local_228._8_8_ != (void *)0x0) {
    operator_delete((void *)local_228._8_8_,local_218._8_8_ - local_228._8_8_);
  }
  if (local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::~vector(&vStack_f0);
  if ((uint32_t *)local_118._16_8_ != (uint32_t *)0x0) {
    operator_delete((void *)local_118._16_8_,
                    (long)local_f8._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl - local_118._16_8_);
  }
  if (local_280 != (long *)0x0) {
    (**(code **)(*local_280 + 8))();
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  return 0;
}

Assistant:

int processBup(std::istream &in, const fs::path &output) {
	fs::path outputDir = output.parent_path();
	std::string outTemplate = output.stem().string();

	std::unique_ptr<BupOutputter> out = SAVE_BUP_AS_PARTS ? BupOutputter::makeParts() : BupOutputter::makeComposited();

	BupHeader header;
	in >> header;

	Image base({header.width, header.height}), currentChunk({0, 0});
	std::vector<MaskRect> maskData;

	for (const auto& chunk : header.chunks) {
		size_t i = &chunk - &header.chunks[0];

		Point pos = processChunk(currentChunk, maskData, chunk.offset, in, outTemplate + "_BaseChunk" + std::to_string(i), header.isSwitch);

		currentChunk.drawOnto(base, pos, maskData);
	}
	if (SHOULD_WRITE_DEBUG_IMAGES) {
		base.writePNG(debugImagePath/(outTemplate + "_Base.png"));
	}

	out->setBase(outputDir, std::move(base), outTemplate);

	Image withEyes({0, 0});

	for (const auto& expChunk : header.expChunks) {
		withEyes = base;

		if (expChunk.face.offset) {
			Point facePos = processChunk(currentChunk, maskData, expChunk.face.offset, in, outTemplate + "_" + expChunk.name + "_Face", header.isSwitch);
			out->newFace(currentChunk, facePos, expChunk.name, maskData);
		} else {
			out->newFace(Image(), {0, 0}, "", {});
		}

		bool atLeastOneMouth = false;
		for (int i = 0; i < expChunk.mouths.size(); i++) {
			const auto& mouth = expChunk.mouths[i];

			if (!mouth.offset) { continue; }
			atLeastOneMouth = true;

			Image withMouth = withEyes;

			Point mouthPos = processChunk(currentChunk, maskData, mouth.offset, in, outTemplate + "_" + expChunk.name + "_Mouth" + std::to_string(i), header.isSwitch);
			out->newMouth(currentChunk, mouthPos, i, maskData);
			out->write();
		}
		if (!atLeastOneMouth) {
			out->write();
		}
	}

	return 0;
}